

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O0

void Cudd_SymmProfile(DdManager *table,int lower,int upper)

{
  uint uVar1;
  uint local_2c;
  uint local_28;
  int TotalSymmGroups;
  int TotalSymm;
  int gbot;
  int x;
  int i;
  int upper_local;
  int lower_local;
  DdManager *table_local;
  
  local_28 = 0;
  local_2c = 0;
  for (gbot = lower; gbot <= upper; gbot = gbot + 1) {
    if (table->subtables[gbot].next != gbot) {
      TotalSymm = gbot;
      fprintf((FILE *)table->out,"Group:");
      uVar1 = TotalSymm;
      do {
        TotalSymm = uVar1;
        fprintf((FILE *)table->out,"  %d",(ulong)(uint)table->invperm[TotalSymm]);
        local_28 = local_28 + 1;
        uVar1 = table->subtables[TotalSymm].next;
      } while (uVar1 != gbot);
      local_2c = local_2c + 1;
      gbot = TotalSymm;
      fprintf((FILE *)table->out,"\n");
    }
  }
  fprintf((FILE *)table->out,"Total Symmetric = %d\n",(ulong)local_28);
  fprintf((FILE *)table->out,"Total Groups = %d\n",(ulong)local_2c);
  return;
}

Assistant:

void
Cudd_SymmProfile(
  DdManager * table,
  int  lower,
  int  upper)
{
    int i,x,gbot;
    int TotalSymm = 0;
    int TotalSymmGroups = 0;

    for (i = lower; i <= upper; i++) {
        if (table->subtables[i].next != (unsigned) i) {
            x = i;
            (void) fprintf(table->out,"Group:");
            do {
                (void) fprintf(table->out,"  %d",table->invperm[x]);
                TotalSymm++;
                gbot = x;
                x = table->subtables[x].next;
            } while (x != i);
            TotalSymmGroups++;
#ifdef DD_DEBUG
            assert(table->subtables[gbot].next == (unsigned) i);
#endif
            i = gbot;
            (void) fprintf(table->out,"\n");
        }
    }
    (void) fprintf(table->out,"Total Symmetric = %d\n",TotalSymm);
    (void) fprintf(table->out,"Total Groups = %d\n",TotalSymmGroups);

}